

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O1

int GetCode(gdIOCtx *fd,CODE_STATIC_DATA *scd,int code_size,int flag,int *ZeroDataBlockP)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  if (flag == 0) {
    if (scd->lastbit <= scd->curbit + code_size) {
      if (scd->done != 0) {
        return -1;
      }
      scd->buf[0] = scd->buf[(long)scd->last_byte + -2];
      scd->buf[1] = scd->buf[(long)scd->last_byte + -1];
      uVar2 = GetDataBlock(fd,scd->buf + 2,ZeroDataBlockP);
      uVar2 = uVar2 & 0xff;
      if (uVar2 == 0) {
        scd->done = 1;
      }
      scd->last_byte = uVar2 + 2;
      scd->curbit = (scd->curbit - scd->lastbit) + 0x10;
      scd->lastbit = uVar2 * 8 + 0x10;
    }
    iVar1 = scd->curbit;
    uVar2 = 0xffffffff;
    if ((iVar1 + code_size < 0x8c1) && (uVar2 = 0, 0 < code_size)) {
      iVar3 = 0;
      do {
        uVar4 = iVar1 + iVar3;
        uVar5 = iVar1 + 7 + iVar3;
        if (-1 < (int)uVar4) {
          uVar5 = uVar4;
        }
        uVar2 = uVar2 | (uint)((scd->buf[(int)uVar5 >> 3] >> (uVar4 & 7) & 1) != 0) <<
                        ((byte)iVar3 & 0x1f);
        iVar3 = iVar3 + 1;
      } while (code_size != iVar3);
    }
    scd->curbit = iVar1 + code_size;
  }
  else {
    scd->curbit = 0;
    scd->lastbit = 0;
    scd->done = 0;
    scd->last_byte = 2;
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

static int
GetCode(gdIOCtx *fd, CODE_STATIC_DATA *scd, int code_size, int flag, int *ZeroDataBlockP)
{
	int rv;

	rv = GetCode_(fd, scd, code_size,flag, ZeroDataBlockP);

	if(VERBOSE) {
		printf("[GetCode(,%d,%d) returning %d]\n",code_size,flag,rv);
	}

	return rv;
}